

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter_gui.c
# Opt level: O3

void sendatoms(int argc,t_atom *argv,int raw)

{
  t_symbol *s;
  char *pcVar1;
  t_atom *a;
  t_float tVar2;
  
  if (0 < argc) {
    do {
      switch(argv->a_type) {
      case A_FLOAT:
        tVar2 = atom_getfloat(argv);
        sys_vgui("%g ",(double)tVar2);
        break;
      case A_SYMBOL:
      case A_DOLLSYM:
        s = (t_symbol *)((argv->a_w).w_symbol)->s_name;
        if (raw == 0) {
          s = (t_symbol *)str_escape((char *)s,0);
          pcVar1 = "{%s} ";
        }
        else {
          pcVar1 = "%s ";
        }
        goto LAB_00173812;
      case A_POINTER:
        s = (argv->a_w).w_symbol;
        pcVar1 = "%p ";
LAB_00173812:
        sys_vgui(pcVar1,s);
        break;
      case A_SEMI:
        pcVar1 = "\\; ";
        goto LAB_00173822;
      case A_COMMA:
        if (raw == 0) {
          pcVar1 = "{,} ";
        }
        else {
          pcVar1 = ", ";
        }
LAB_00173822:
        sys_vgui(pcVar1);
        break;
      case A_DOLLAR:
        if (raw == 0) {
          pcVar1 = "{$%d} ";
        }
        else {
          pcVar1 = "$%d ";
        }
        sys_vgui(pcVar1,(ulong)(uint)(argv->a_w).w_index);
      }
      argv = argv + 1;
      argc = argc + -1;
    } while (argc != 0);
  }
  return;
}

Assistant:

static void sendatoms(int argc, t_atom*argv, int raw) {
    int i;
    for(i=0; i<argc; i++)
    {
        t_atom *a=argv++;
        switch (a->a_type) {
        default:
            break;
        case A_FLOAT:
                /* HACK: currently ATOMARRAY is only used for setting fonts
                 * and Tcl/Tk is picky when it receives non-integers as fontsize
                 */
            sys_vgui("%g ", atom_getfloat(a));
            break;
        case A_DOLLAR:
            if(raw)
                sys_vgui("$%d ", a->a_w.w_index);
            else
                sys_vgui("{$%d} ", a->a_w.w_index);
            break;
        case A_DOLLSYM:
        case A_SYMBOL:
            if(raw)
                sys_vgui("%s ", a->a_w.w_symbol->s_name);
            else
                sys_vgui("{%s} ", str_escape(a->a_w.w_symbol->s_name, 0));
            break;
        case A_POINTER:
            sys_vgui("%p ", a->a_w.w_gpointer);
            break;
        case A_SEMI:
            sys_vgui("\\; ");
            break;
        case A_COMMA:
            if (raw)
                sys_vgui(", ");
            else
                sys_vgui("{,} ");
            break;
        }
    }
}